

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O3

void Opal_Sample(Opal *self,int16_t *left,int16_t *right)

{
  short sVar1;
  short sVar2;
  OpalOperator *pOVar3;
  int16_t iVar4;
  int16_t iVar5;
  int16_t iVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint16_t uVar14;
  int iVar15;
  int iVar16;
  int16_t in_R9W;
  uint32_t phase_step;
  uint uVar17;
  
  iVar9 = self->SampleRate;
  iVar15 = self->SampleAccum;
  if (iVar15 < iVar9) {
    iVar5 = self->CurrOutput[0];
  }
  else {
    uVar17 = (uint)(ushort)self->CurrOutput[0];
    uVar13 = (uint)(ushort)self->CurrOutput[1];
    do {
      self->LastOutput[0] = (int16_t)uVar17;
      self->LastOutput[1] = (int16_t)uVar13;
      lVar12 = 0x5e;
      uVar13 = 0;
      uVar17 = 0;
      do {
        if (*(int *)((long)self->LastOutput + lVar12 + -0x16) == 0) {
          iVar9 = 0;
          iVar15 = 0;
        }
        else {
          lVar10 = *(long *)((long)self->LastOutput + lVar12 + -0x36);
          uVar7 = *(ushort *)(lVar10 + 0x1698);
          if ((uVar7 & 3) == 0) {
            uVar8 = 0;
          }
          else {
            uVar11 = ((*(ushort *)((long)self->LastOutput + lVar12 + -0x2e) >> 7 & 7) >>
                     (*(int *)(lVar10 + 0x16a4) == 0)) >> ((byte)uVar7 & 1);
            uVar8 = -uVar11;
            if ((uVar7 & 4) == 0) {
              uVar8 = uVar11;
            }
            uVar8 = uVar8 & 0xffff;
          }
          lVar10 = *(long *)((long)self->LastOutput + lVar12 + -0x1e);
          phase_step = (uint32_t)
                       (short)(uVar8 << (*(byte *)((long)self->LastOutput + lVar12 + -0x2c) & 0x1f))
          ;
          if (lVar10 == 0) {
            sVar1 = *(short *)((long)self->LastOutput + lVar12 + -0x22);
            iVar5 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar12 + -0x56),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a),
                                        phase_step,0,
                                        *(int16_t *)((long)self->LastOutput + lVar12 + -0x24),in_R9W
                                       );
            pOVar3 = *(OpalOperator **)((long)self->LastOutput + lVar12 + -0x4e);
            uVar14 = (uint16_t)*(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a);
            if (sVar1 == 0) {
              iVar5 = OpalOperator_Output(pOVar3,uVar14,phase_step,iVar5,0,in_R9W);
            }
            else {
              iVar4 = OpalOperator_Output(pOVar3,uVar14,phase_step,0,0,in_R9W);
              iVar5 = iVar5 + iVar4;
            }
          }
          else {
            sVar1 = *(short *)(lVar10 + 0x34);
            sVar2 = *(short *)((long)self->LastOutput + lVar12 + -0x22);
            iVar4 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar12 + -0x56),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a),
                                        phase_step,0,
                                        *(int16_t *)((long)self->LastOutput + lVar12 + -0x24),in_R9W
                                       );
            pOVar3 = *(OpalOperator **)((long)self->LastOutput + lVar12 + -0x4e);
            uVar14 = (uint16_t)*(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a);
            if (sVar1 == 0) {
              if (sVar2 == 0) {
                iVar5 = OpalOperator_Output(pOVar3,uVar14,phase_step,iVar4,0,in_R9W);
                iVar5 = OpalOperator_Output(*(OpalOperator **)
                                             ((long)self->LastOutput + lVar12 + -0x46),
                                            (uint16_t)
                                            *(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a)
                                            ,phase_step,iVar5,0,in_R9W);
                iVar5 = OpalOperator_Output(*(OpalOperator **)
                                             ((long)self->LastOutput + lVar12 + -0x3e),
                                            (uint16_t)
                                            *(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a)
                                            ,phase_step,iVar5,0,in_R9W);
              }
              else {
                iVar5 = OpalOperator_Output(pOVar3,uVar14,phase_step,0,0,in_R9W);
                iVar5 = OpalOperator_Output(*(OpalOperator **)
                                             ((long)self->LastOutput + lVar12 + -0x46),
                                            (uint16_t)
                                            *(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a)
                                            ,phase_step,iVar5,0,in_R9W);
                iVar5 = OpalOperator_Output(*(OpalOperator **)
                                             ((long)self->LastOutput + lVar12 + -0x3e),
                                            (uint16_t)
                                            *(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a)
                                            ,phase_step,iVar5,0,in_R9W);
                iVar5 = iVar4 + iVar5;
              }
            }
            else if (sVar2 == 0) {
              iVar4 = OpalOperator_Output(pOVar3,uVar14,phase_step,iVar4,0,in_R9W);
              iVar5 = OpalOperator_Output(*(OpalOperator **)
                                           ((long)self->LastOutput + lVar12 + -0x46),
                                          (uint16_t)
                                          *(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a),
                                          phase_step,0,0,in_R9W);
              iVar5 = OpalOperator_Output(*(OpalOperator **)
                                           ((long)self->LastOutput + lVar12 + -0x3e),
                                          (uint16_t)
                                          *(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a),
                                          phase_step,iVar5,0,in_R9W);
              iVar5 = iVar5 + iVar4;
            }
            else {
              iVar5 = OpalOperator_Output(pOVar3,uVar14,phase_step,0,0,in_R9W);
              iVar5 = OpalOperator_Output(*(OpalOperator **)
                                           ((long)self->LastOutput + lVar12 + -0x46),
                                          (uint16_t)
                                          *(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a),
                                          phase_step,iVar5,0,in_R9W);
              iVar6 = OpalOperator_Output(*(OpalOperator **)
                                           ((long)self->LastOutput + lVar12 + -0x3e),
                                          (uint16_t)
                                          *(undefined4 *)((long)self->LastOutput + lVar12 + -0x2a),
                                          phase_step,0,0,in_R9W);
              iVar5 = iVar6 + iVar4 + iVar5;
            }
          }
          iVar15 = *(int *)((long)self->LastOutput + lVar12 + -0x12);
          iVar16 = (int)iVar5;
          if (iVar15 != 0) {
            iVar15 = iVar16;
          }
          iVar15 = (uint)*(ushort *)((long)self->LastOutput + lVar12 + -10) * iVar15;
          iVar9 = iVar15 + 0xffff;
          if (-1 < iVar15) {
            iVar9 = iVar15;
          }
          iVar9 = iVar9 >> 0x10;
          if (*(int *)((long)self->LastOutput + lVar12 + -0xe) == 0) {
            iVar16 = 0;
          }
          iVar16 = (uint)*(ushort *)((long)self->LastOutput + lVar12 + -8) * iVar16;
          iVar15 = iVar16 + 0xffff;
          if (-1 < iVar16) {
            iVar15 = iVar16;
          }
          iVar15 = iVar15 >> 0x10;
        }
        uVar13 = uVar13 + iVar15;
        uVar17 = uVar17 + iVar9;
        lVar12 = lVar12 + 0x50;
      } while (lVar12 != 0x5fe);
      if (0x7ffe < (int)uVar17) {
        uVar17 = 0x7fff;
      }
      if ((int)uVar17 < -0x7fff) {
        uVar17 = 0xffff8000;
      }
      iVar5 = (int16_t)uVar17;
      if (0x7ffe < (int)uVar13) {
        uVar13 = 0x7fff;
      }
      self->CurrOutput[0] = iVar5;
      if ((int)uVar13 < -0x7fff) {
        uVar13 = 0xffff8000;
      }
      self->CurrOutput[1] = (int16_t)uVar13;
      self->Clock = self->Clock + 1;
      uVar11 = ((self->TremoloClock + 1) / 0x3480) * -0x3480 + (uint)self->TremoloClock + 1;
      self->TremoloClock = (uint16_t)uVar11;
      uVar8 = 0x3480 - uVar11;
      if (uVar11 < 0x1a40) {
        uVar8 = uVar11;
      }
      self->TremoloLevel = (uint16_t)(uVar8 >> 8);
      if (self->TremoloDepth == 0) {
        self->TremoloLevel = (uint16_t)(uVar8 >> 10);
      }
      uVar7 = self->VibratoTick + 1;
      self->VibratoTick = uVar7;
      if (0x3ff < uVar7) {
        self->VibratoTick = 0;
        self->VibratoClock = (short)*(undefined4 *)&self->VibratoClock + 1U & 7;
      }
      iVar9 = self->SampleRate;
      iVar15 = self->SampleAccum - iVar9;
      self->SampleAccum = iVar15;
    } while (iVar9 <= iVar15);
  }
  lVar10 = ((long)(iVar9 / 2) + (long)iVar15 * 0x10000) / (long)iVar9;
  lVar12 = -0x80000000;
  if (-0x80000000 < lVar10) {
    lVar12 = lVar10;
  }
  if (0x7ffffffe < lVar12) {
    lVar12 = 0x7fffffff;
  }
  iVar16 = ((int)iVar5 - (int)self->LastOutput[0]) * (int)lVar12;
  iVar9 = iVar16 + 0xffff;
  if (-1 < iVar16) {
    iVar9 = iVar16;
  }
  *left = (short)((uint)iVar9 >> 0x10) + self->LastOutput[0];
  iVar16 = ((int)self->CurrOutput[1] - (int)self->LastOutput[1]) * (int)lVar12;
  iVar9 = iVar16 + 0xffff;
  if (-1 < iVar16) {
    iVar9 = iVar16;
  }
  *right = (short)((uint)iVar9 >> 0x10) + self->LastOutput[1];
  self->SampleAccum = iVar15 + 0xc234;
  return;
}

Assistant:

void Opal_Sample(Opal *self, int16_t* left, int16_t* right)
{
    int32_t fract;

    /* If the destination sample rate is higher than the OPL3 sample rate, we need to skip ahead */
    while(self->SampleAccum >= self->SampleRate)
    {
        self->LastOutput[0] = self->CurrOutput[0];
        self->LastOutput[1] = self->CurrOutput[1];

        Opal_Output(self, &self->CurrOutput[0], &self->CurrOutput[1]);

        self->SampleAccum -= self->SampleRate;
    }

    /* Mix with the partial accumulation */
    fract = s_opal_MulDivR(self->SampleAccum, 65536, self->SampleRate);
    *left = (int16_t)(self->LastOutput[0] + ((fract * (self->CurrOutput[0] - self->LastOutput[0])) / 65536));
    *right = (int16_t)(self->LastOutput[1] + ((fract * (self->CurrOutput[1] - self->LastOutput[1])) / 65536));

    self->SampleAccum += OpalOPL3SampleRate;
}